

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

void __thiscall gl3cts::TransformFeedback::DiscardGeometry::draw(DiscardGeometry *this)

{
  GLuint in_ESI;
  
  draw((DiscardGeometry *)
       ((long)&(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved +
       (long)(this->super_CaptureGeometryInterleaved)._vptr_CaptureGeometryInterleaved[-10]),in_ESI)
  ;
  return;
}

Assistant:

void gl3cts::TransformFeedback::DiscardGeometry::draw(glw::GLuint primitive_case)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Must clear before rasterizer discard */
	gl.clear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glClear call failed.");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable call failed.");

	gl3cts::TransformFeedback::CaptureGeometryInterleaved::draw(primitive_case);

	gl.disable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDisable call failed.");
}